

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result_conflict *
validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
          (Result_conflict *__return_storage_ptr__,ModelDescription *modelDescription,
          NeuralNetworkClassifier *nn)

{
  FeatureDescription *pFVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  LossLayer *pLVar7;
  CategoricalCrossEntropyLossLayer *this;
  MeanSquaredErrorLossLayer *this_00;
  FeatureDescription *pFVar8;
  reference pvVar9;
  string *psVar10;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_01;
  reference this_02;
  FeatureType *pFVar11;
  FeatureType *b;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  undefined1 local_180 [8];
  string targetTypeString;
  FeatureDescription *output;
  const_iterator __end4;
  const_iterator __begin4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range4;
  FeatureDescription *local_f8;
  FeatureDescription *trainingInputDescription;
  size_t i_1;
  bool trainingInputMeetsRequirement;
  NetworkUpdateParameters *pNStack_e0;
  bool isClassifier;
  NetworkUpdateParameters *updateParams;
  long local_b8;
  size_t numberOfNonExclusiveTrainingInputs;
  FeatureDescription *input;
  int j;
  bool trainingInputIsPredictionInput;
  FeatureDescription *trainingInput;
  undefined1 local_90 [4];
  int i;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  undefined1 local_68 [40];
  Result_conflict r;
  NeuralNetworkClassifier *nn_local;
  ModelDescription *modelDescription_local;
  
  r._32_8_ = nn;
  CoreML::Result::Result((Result *)(local_68 + 0x20));
  std::__cxx11::string::string((string *)local_68);
  iVar4 = CoreML::Specification::ModelDescription::traininginput_size(modelDescription);
  if (iVar4 < 2) {
    std::__cxx11::string::operator=
              ((string *)local_68,
               "Must provide training inputs for updatable neural network (expecting both input and target for loss function)."
              );
    CoreML::Result::Result
              ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
               (string *)local_68);
    trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
    for (trainingInput._4_4_ = 0; iVar4 = trainingInput._4_4_,
        iVar5 = CoreML::Specification::ModelDescription::traininginput_size(modelDescription),
        iVar4 < iVar5; trainingInput._4_4_ = trainingInput._4_4_ + 1) {
      _j = CoreML::Specification::ModelDescription::traininginput
                     (modelDescription,trainingInput._4_4_);
      input._7_1_ = 0;
      for (input._0_4_ = 0; iVar4 = (int)input,
          iVar5 = CoreML::Specification::ModelDescription::input_size(modelDescription),
          iVar4 < iVar5; input._0_4_ = (int)input + 1) {
        numberOfNonExclusiveTrainingInputs =
             (size_t)CoreML::Specification::ModelDescription::input(modelDescription,(int)input);
        bVar2 = CoreML::Specification::isEquivalent
                          (_j,(FeatureDescription *)numberOfNonExclusiveTrainingInputs);
        if (bVar2) {
          input._7_1_ = 1;
          break;
        }
      }
      if ((input._7_1_ & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_90,
                   (value_type_conflict3 *)((long)&trainingInput + 4));
      }
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_90);
    if (sVar6 == 0) {
      std::__cxx11::string::operator=
                ((string *)local_68,
                 "Training inputs don\'t describe required inputs for the loss (needs both the input and the target)."
                );
      CoreML::Result::Result
                ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                 (string *)local_68);
      trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    else {
      iVar4 = CoreML::Specification::ModelDescription::traininginput_size(modelDescription);
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_90);
      local_b8 = (long)iVar4 - sVar6;
      if (local_b8 == 0) {
        std::__cxx11::string::operator=
                  ((string *)local_68,
                   "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction)."
                  );
        CoreML::Result::Result
                  ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                   (string *)local_68);
        trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      else {
        std::__cxx11::string::string((string *)&updateParams);
        pNStack_e0 = CoreML::Specification::NeuralNetworkClassifier::updateparams
                               ((NeuralNetworkClassifier *)r._32_8_);
        pLVar7 = CoreML::Specification::NetworkUpdateParameters::losslayers(pNStack_e0,0);
        bVar2 = CoreML::Specification::LossLayer::has_categoricalcrossentropylosslayer(pLVar7);
        if (bVar2) {
          pLVar7 = CoreML::Specification::NetworkUpdateParameters::losslayers(pNStack_e0,0);
          this = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(pLVar7);
          psVar10 = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(this)
          ;
          std::__cxx11::string::operator=((string *)&updateParams,(string *)psVar10);
        }
        else {
          pLVar7 = CoreML::Specification::NetworkUpdateParameters::losslayers(pNStack_e0,0);
          bVar2 = CoreML::Specification::LossLayer::has_meansquarederrorlosslayer(pLVar7);
          if (bVar2) {
            pLVar7 = CoreML::Specification::NetworkUpdateParameters::losslayers(pNStack_e0,0);
            this_00 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(pLVar7);
            psVar10 = CoreML::Specification::MeanSquaredErrorLossLayer::target_abi_cxx11_(this_00);
            std::__cxx11::string::operator=((string *)&updateParams,(string *)psVar10);
          }
        }
        i_1._7_1_ = r._32_8_ != 0;
        i_1._6_1_ = 0;
        for (trainingInputDescription = (FeatureDescription *)0x0; pFVar1 = trainingInputDescription
            , pFVar8 = (FeatureDescription *)
                       std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)local_90), pFVar1 < pFVar8;
            trainingInputDescription =
                 (FeatureDescription *)
                 ((long)&(trainingInputDescription->super_MessageLite)._vptr_MessageLite + 1)) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_90,
                              (size_type)trainingInputDescription);
          local_f8 = CoreML::Specification::ModelDescription::traininginput
                               (modelDescription,*pvVar9);
          psVar10 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(local_f8);
          std::__cxx11::string::string((string *)&__range4,(string *)psVar10);
          if ((i_1._7_1_ & 1) != 0) {
            psVar10 = CoreML::Specification::ModelDescription::predictedfeaturename_abi_cxx11_
                                (modelDescription);
            _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range4,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)psVar10);
            if (_Var3) {
              this_01 = CoreML::Specification::ModelDescription::output(modelDescription);
              __end4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                       ::begin(this_01);
              output = (FeatureDescription *)
                       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                       ::end(this_01);
              while (bVar2 = google::protobuf::internal::
                             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                             operator!=(&__end4,(iterator *)&output), bVar2) {
                this_02 = google::protobuf::internal::
                          RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                          operator*(&__end4);
                psVar10 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(this_02);
                _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&__range4,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)psVar10);
                if (_Var3) {
                  pFVar11 = CoreML::Specification::FeatureDescription::type(local_f8);
                  b = CoreML::Specification::FeatureDescription::type(this_02);
                  bVar2 = CoreML::Specification::operator==(pFVar11,b);
                  if (!bVar2) {
                    pFVar11 = CoreML::Specification::FeatureDescription::type(this_02);
                    bVar2 = CoreML::Specification::FeatureType::has_int64type(pFVar11);
                    pcVar12 = "String";
                    if (bVar2) {
                      pcVar12 = "Int64";
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&targetTypeString._M_storage,pcVar12,
                               (allocator *)
                               ((long)&targetTypeString.super__Rb_tree_node_base._M_right + 7));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&targetTypeString.super__Rb_tree_node_base._M_right + 7));
                    pFVar11 = CoreML::Specification::FeatureDescription::type(local_f8);
                    bVar2 = CoreML::Specification::FeatureType::has_int64type(pFVar11);
                    pcVar12 = "String";
                    if (bVar2) {
                      pcVar12 = "Int64";
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)local_180,pcVar12,&local_181);
                    std::allocator<char>::~allocator((allocator<char> *)&local_181);
                    std::operator+(&local_248,"The type of the training input provided: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__range4);
                    std::operator+(&local_228,&local_248,
                                   " doesn\'t match the expected type of the classifier. Found: ");
                    std::operator+(&local_208,&local_228,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_180);
                    std::operator+(&local_1e8,&local_208,", expected: ");
                    std::operator+(&local_1c8,&local_1e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&targetTypeString._M_storage);
                    std::operator+(&local_1a8,&local_1c8,".");
                    std::__cxx11::string::operator=((string *)local_68,(string *)&local_1a8);
                    std::__cxx11::string::~string((string *)&local_1a8);
                    std::__cxx11::string::~string((string *)&local_1c8);
                    std::__cxx11::string::~string((string *)&local_1e8);
                    std::__cxx11::string::~string((string *)&local_208);
                    std::__cxx11::string::~string((string *)&local_228);
                    std::__cxx11::string::~string((string *)&local_248);
                    CoreML::Result::Result
                              ((Result *)__return_storage_ptr__,
                               INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_68);
                    trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                    std::__cxx11::string::~string((string *)local_180);
                    std::__cxx11::string::~string((string *)&targetTypeString._M_storage);
                    goto LAB_0039a147;
                  }
                  i_1._6_1_ = 1;
                  break;
                }
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++
                          (&__end4);
              }
            }
          }
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&updateParams,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range4);
          if (_Var3) {
            i_1._6_1_ = 1;
          }
          trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_0039a147:
          std::__cxx11::string::~string((string *)&__range4);
          if ((int)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0039a299;
        }
        if ((i_1._6_1_ & 1) == 0) {
          if ((i_1._7_1_ & 1) == 0) {
            std::operator+(&local_288,
                           "The training inputs don\'t include the loss layer\'s target: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &updateParams);
            std::__cxx11::string::operator=((string *)local_68,(string *)&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            CoreML::Result::Result
                      ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_68);
            trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          else {
            psVar10 = CoreML::Specification::ModelDescription::predictedfeaturename_abi_cxx11_
                                (modelDescription);
            std::operator+(&local_268,
                           "The training inputs don\'t include the target of the classifier: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar10);
            std::__cxx11::string::operator=((string *)local_68,(string *)&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            CoreML::Result::Result
                      ((Result *)__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_68);
            trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          CoreML::Result::Result((Result *)__return_storage_ptr__);
          trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
LAB_0039a299:
        std::__cxx11::string::~string((string *)&updateParams);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  }
  std::__cxx11::string::~string((string *)local_68);
  CoreML::Result::~Result((Result *)(local_68 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}